

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_Array.h
# Opt level: O2

int __thiscall
axl::sl::
Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
::copy(Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
       *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  Hdr *p;
  bool bVar1;
  EVP_PKEY_CTX *src_00;
  int iVar2;
  Ptr<void> shadow;
  Ptr<void> local_28;
  
  if (src == (EVP_PKEY_CTX *)0x0) {
    clear(this);
    iVar2 = 0;
  }
  else {
    shadow.m_p = (void *)0x0;
    shadow.m_refCount = (RefCount *)0x0;
    p = (this->
        super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
        ).m_hdr;
    if (((p != (Hdr *)0x0) && (&p->m_count <= dst)) &&
       (dst < (EVP_PKEY_CTX *)((long)&p->m_count + (p->super_BufHdr).m_bufferSize))) {
      rc::Ptr<void>::
      Ptr<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>>::Hdr>
                (&local_28,p);
      rc::Ptr<void>::copy(&shadow,(EVP_PKEY_CTX *)&local_28,src_00);
      rc::Ptr<void>::~Ptr(&local_28);
    }
    bVar1 = Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>>>
            ::
            setCountImpl<axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>>::Construct>
                      ((Array<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>,axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>,axl::sl::HashTableEntry<char,axl::sl::SwitchInfo*>::GetBucketLink>>>
                        *)this,(size_t)src);
    if (bVar1) {
      ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
      ::copy((ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>
              *)(this->
                super_ArrayRef<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>,_axl::sl::ArrayDetails<axl::sl::AuxList<axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>,_axl::sl::HashTableEntry<char,_axl::sl::SwitchInfo_*>::GetBucketLink>_>_>
                ).m_p,dst,src);
    }
    else {
      src = (EVP_PKEY_CTX *)0xffffffffffffffff;
    }
    iVar2 = (int)src;
    rc::Ptr<void>::~Ptr(&shadow);
  }
  return iVar2;
}

Assistant:

size_t
	copy(
		const T* p,
		size_t count
	) {
		if (count == 0) {
			clear();
			return 0;
		}

		rc::Ptr<void> shadow;
		if (this->m_hdr && this->m_hdr->isInsideBuffer(p))
			if (Details::IsSimple) {
				// for simple non-ctor-dtor types we can apply in-buffer shift

				T* end = (T*)this->m_hdr->getEnd();
				ASSERT(p + count <= end);

				this->m_p = (T*)p;
				this->m_count = count;
				return count;
			} else {
				shadow = this->m_hdr; // ensure we keep p intact
			}

		bool result = setCount(count);
		if (!result)
			return -1;

		Details::copy(this->m_p, p, count);
		return count;
	}